

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,SVInt *value)

{
  bool bVar1;
  bool unknownFlag;
  bitwidth_t bits;
  uint32_t uVar2;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  uint64_t *puVar3;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar4;
  undefined8 in_RCX;
  EVP_PKEY_CTX *in_RSI;
  Token *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SVInt *in_stack_00000010;
  SVInt *in_stack_00000018;
  SVIntStorage storage;
  size_t in_stack_ffffffffffffff70;
  BumpAllocator *in_stack_ffffffffffffff78;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_68;
  bitwidth_t local_60;
  undefined2 local_5c;
  undefined8 local_58;
  undefined8 local_40;
  undefined8 local_38;
  EVP_PKEY_CTX *local_28;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_28 = in_RSI;
  local_18 = in_R9;
  local_10 = in_RCX;
  local_8 = in_R8;
  NumericTokenFlags::NumericTokenFlags(&in_RDI->numFlags);
  in_RDI->rawLen = 0;
  in_RDI->info = (Info *)0x0;
  local_40 = local_10;
  local_38 = local_8;
  local_58 = local_18;
  init(in_RDI,local_28);
  bits = SVInt::getBitWidth(in_stack_00000018);
  bVar1 = SVInt::isSigned(in_stack_00000018);
  unknownFlag = SVInt::hasUnknown(in_stack_00000018);
  SVIntStorage::SVIntStorage((SVIntStorage *)&local_68,bits,bVar1,unknownFlag);
  bVar1 = SVInt::isSingleWord(in_stack_00000018);
  if (bVar1) {
    puVar3 = SVInt::getRawPtr(in_stack_00000010);
    local_68.val = *puVar3;
  }
  else {
    SVInt::getNumWords((SVInt *)0x3855a4);
    __dest.pVal = (uint64_t *)
                  BumpAllocator::allocate
                            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(size_t)local_28);
    local_68.pVal = __dest.pVal;
    puVar3 = SVInt::getRawPtr(in_stack_00000010);
    uVar2 = SVInt::getNumWords((SVInt *)0x3855e9);
    memcpy(__dest.pVal,puVar3,(ulong)uVar2 << 3);
  }
  paVar4 = &Info::integer((Info *)0x38560e)->field_0;
  *paVar4 = local_68;
  *(bitwidth_t *)(paVar4 + 1) = local_60;
  *(undefined2 *)((long)paVar4 + 0xc) = local_5c;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, const SVInt& value) {
    SLANG_ASSERT(kind == TokenKind::IntegerLiteral);
    init(alloc, kind, trivia, rawText, location);

    SVIntStorage storage(value.getBitWidth(), value.isSigned(), value.hasUnknown());
    if (value.isSingleWord())
        storage.val = *value.getRawPtr();
    else {
        storage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                 alignof(uint64_t));
        memcpy(storage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }

    info->integer() = storage;
}